

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O0

Aig_Obj_t * Bmc_ObjChild0Frames(Aig_Obj_t *pObj,int i)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *local_20;
  int i_local;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 == 0) {
    pAVar2 = Aig_ObjFanin0(pObj);
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      local_20 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar2 = Aig_ObjFanin0(pObj);
      pAVar2 = Bmc_ObjFrames(pAVar2,i);
      iVar1 = Aig_ObjFaninC0(pObj);
      local_20 = Aig_NotCond(pAVar2,iVar1);
    }
    return local_20;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraBmc.c"
                ,0x36,"Aig_Obj_t *Bmc_ObjChild0Frames(Aig_Obj_t *, int)");
}

Assistant:

static inline Aig_Obj_t *  Bmc_ObjChild0Frames( Aig_Obj_t * pObj, int i ) { assert( !Aig_IsComplement(pObj) ); return Aig_ObjFanin0(pObj)? Aig_NotCond(Bmc_ObjFrames(Aig_ObjFanin0(pObj),i), Aig_ObjFaninC0(pObj)) : NULL;  }